

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

optional<unsigned_long> ParseByteUnits(string_view str,ByteUnit default_multiplier)

{
  string_view str_00;
  bool bVar1;
  compare_three_way_result_t<unsigned_long,_unsigned_long> cVar2;
  const_reference pvVar3;
  basic_string_view<char,_std::char_traits<char>_> *this;
  Elf64_Ehdr *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  long in_FS_OFFSET;
  optional<unsigned_long> oVar5;
  uint64_t unit_amount;
  char unit;
  ByteUnit multiplier;
  optional<unsigned_long> parsed_num;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  bool bVar6;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char local_79;
  Elf64_Ehdr *local_78;
  size_t in_stack_ffffffffffffff90;
  Elf64_Ehdr *pEVar7;
  _Storage<unsigned_long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = in_RDX;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_stack_ffffffffffffff48);
  if (bVar1) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_18);
    uVar4 = extraout_RDX;
  }
  else {
    pEVar7 = local_78;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back(in_stack_ffffffffffffff58);
    local_79 = *pvVar3;
    this = (basic_string_view<char,_std::char_traits<char>_> *)(ulong)((int)local_79 - 0x47);
    switch(this) {
    case (basic_string_view<char,_std::char_traits<char>_> *)0x0:
      local_78 = (Elf64_Ehdr *)0x40000000;
      break;
    default:
      local_79 = '\0';
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0x4:
      local_78 = (Elf64_Ehdr *)0x400;
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0x6:
      local_78 = &std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  basic_string;
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0xd:
      local_78 = (Elf64_Ehdr *)0x10000000000;
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0x20:
      local_78 = (Elf64_Ehdr *)0x3b9aca00;
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0x24:
      local_78 = (Elf64_Ehdr *)0x3e8;
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0x26:
      local_78 = (Elf64_Ehdr *)0xf4240;
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0x2d:
      local_78 = (Elf64_Ehdr *)0xe8d4a51000;
    }
    if (local_79 != '\0') {
      std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff48);
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                (this,CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (size_type)local_78);
    }
    str_00._M_str = (char *)pEVar7;
    str_00._M_len = in_stack_ffffffffffffff90;
    ToIntegral<unsigned_long>(str_00);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_long> *)in_stack_ffffffffffffff48);
    bVar6 = true;
    if (bVar1) {
      std::numeric_limits<unsigned_long>::max();
      cVar2 = std::operator<=><unsigned_long,_unsigned_long>
                        ((optional<unsigned_long> *)
                         CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),&this->_M_len
                        );
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)in_stack_ffffffffffffff48,(__unspec *)0x1ac8c93);
      bVar6 = std::operator>(cVar2._M_value);
    }
    if (bVar6 == false) {
      std::optional<unsigned_long>::operator*((optional<unsigned_long> *)in_stack_ffffffffffffff48);
      std::optional<unsigned_long>::optional<unsigned_long,_true>
                ((optional<unsigned_long> *)in_stack_ffffffffffffff58,
                 (unsigned_long *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      uVar4 = extraout_RDX_01;
    }
    else {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_18);
      uVar4 = extraout_RDX_00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
    oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_10;
    oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_18._M_value;
    return (optional<unsigned_long>)
           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint64_t> ParseByteUnits(std::string_view str, ByteUnit default_multiplier)
{
    if (str.empty()) {
        return std::nullopt;
    }
    auto multiplier = default_multiplier;
    char unit = str.back();
    switch (unit) {
    case 'k':
        multiplier = ByteUnit::k;
        break;
    case 'K':
        multiplier = ByteUnit::K;
        break;
    case 'm':
        multiplier = ByteUnit::m;
        break;
    case 'M':
        multiplier = ByteUnit::M;
        break;
    case 'g':
        multiplier = ByteUnit::g;
        break;
    case 'G':
        multiplier = ByteUnit::G;
        break;
    case 't':
        multiplier = ByteUnit::t;
        break;
    case 'T':
        multiplier = ByteUnit::T;
        break;
    default:
        unit = 0;
        break;
    }

    uint64_t unit_amount = static_cast<uint64_t>(multiplier);
    auto parsed_num = ToIntegral<uint64_t>(unit ? str.substr(0, str.size() - 1) : str);
    if (!parsed_num || parsed_num > std::numeric_limits<uint64_t>::max() / unit_amount) { // check overflow
        return std::nullopt;
    }
    return *parsed_num * unit_amount;
}